

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::overlapMerge
          (AlignmentRecord *this,string *algn,string *ref,AlignmentRecord *ar,string *dna,
          string *qualities,string *nucigar,int *c_pos1,int *c_pos2,int *q_pos1,int *q_pos2,
          int *ref_pos,int *ref_rel_pos,int i,int j)

{
  char cVar1;
  char cVar2;
  pair<char,_char> pVar3;
  const_reference pvVar4;
  vector<char,_std::allocator<char>_> *pvVar5;
  char *pcVar6;
  AlignmentRecord *in_RCX;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  string *in_R8;
  string *in_R9;
  string *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000048;
  pair<char,_char> resPair;
  string r;
  ShortDnaSequence *s2;
  ShortDnaSequence *s1;
  char c2;
  char c1;
  undefined2 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaa;
  undefined1 in_stack_fffffffffffffeab;
  undefined1 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  ShortDnaSequence *in_stack_fffffffffffffeb0;
  undefined5 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  char *in_stack_fffffffffffffec0;
  undefined5 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecd;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  char local_c2;
  char cStack_c1;
  string local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  ShortDnaSequence *local_48;
  long local_40;
  value_type local_32;
  value_type local_31;
  string *local_30;
  string *local_28;
  AlignmentRecord *local_20;
  string *local_18;
  string *local_10;
  
  local_48 = (ShortDnaSequence *)0x0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (in_stack_00000040 == 1) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),
                        (long)*in_stack_00000010);
    local_31 = *pvVar4;
    local_40 = in_RDI + 0x68;
    getReferenceSeq1_abi_cxx11_
              ((AlignmentRecord *)
               CONCAT17(in_stack_fffffffffffffeaf,
                        CONCAT16(in_stack_fffffffffffffeae,
                                 CONCAT15(in_stack_fffffffffffffead,
                                          CONCAT14(in_stack_fffffffffffffeac,
                                                   CONCAT13(in_stack_fffffffffffffeab,
                                                            CONCAT12(in_stack_fffffffffffffeaa,
                                                                     in_stack_fffffffffffffea8))))))
              );
    std::__cxx11::string::operator=(local_68,local_a0);
    std::__cxx11::string::~string(local_a0);
    if (in_stack_00000048 == 1) {
      pvVar5 = getCigar1Unrolled(local_20);
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar5,(long)*in_stack_00000018)
      ;
      local_32 = *pvVar4;
      local_48 = getSequence1(local_20);
    }
    else {
      pvVar5 = getCigar2Unrolled(local_20);
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar5,(long)*in_stack_00000018)
      ;
      local_32 = *pvVar4;
      local_48 = getSequence2(local_20);
    }
  }
  else {
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xf8),
                        (long)*in_stack_00000010);
    local_31 = *pvVar4;
    local_40 = in_RDI + 0x118;
    getReferenceSeq2_abi_cxx11_
              ((AlignmentRecord *)
               CONCAT17(in_stack_fffffffffffffeaf,
                        CONCAT16(in_stack_fffffffffffffeae,
                                 CONCAT15(in_stack_fffffffffffffead,
                                          CONCAT14(in_stack_fffffffffffffeac,
                                                   CONCAT13(in_stack_fffffffffffffeab,
                                                            CONCAT12(in_stack_fffffffffffffeaa,
                                                                     in_stack_fffffffffffffea8))))))
              );
    std::__cxx11::string::operator=(local_68,local_c0);
    std::__cxx11::string::~string(local_c0);
    if (in_stack_00000048 == 1) {
      pvVar5 = getCigar1Unrolled(local_20);
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar5,(long)*in_stack_00000018)
      ;
      local_32 = *pvVar4;
      local_48 = getSequence1(local_20);
    }
    else {
      pvVar5 = getCigar2Unrolled(local_20);
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar5,(long)*in_stack_00000018)
      ;
      local_32 = *pvVar4;
      local_48 = getSequence2(local_20);
    }
  }
  if ((((local_31 == 'M') && (local_32 == 'M')) || ((local_31 == 'S' && (local_32 == 'S')))) ||
     ((local_31 == 'I' && (local_32 == 'I')))) {
    if (local_31 != 'S') {
      ShortDnaSequence::operator[]
                (in_stack_fffffffffffffeb0,
                 CONCAT17(in_stack_fffffffffffffeaf,
                          CONCAT16(in_stack_fffffffffffffeae,
                                   CONCAT15(in_stack_fffffffffffffead,
                                            CONCAT14(in_stack_fffffffffffffeac,
                                                     CONCAT13(in_stack_fffffffffffffeab,
                                                              CONCAT12(in_stack_fffffffffffffeaa,
                                                                       in_stack_fffffffffffffea8))))
                                  )));
      ShortDnaSequence::qualityChar
                (in_stack_fffffffffffffeb0,
                 CONCAT17(in_stack_fffffffffffffeaf,
                          CONCAT16(in_stack_fffffffffffffeae,
                                   CONCAT15(in_stack_fffffffffffffead,
                                            CONCAT14(in_stack_fffffffffffffeac,
                                                     CONCAT13(in_stack_fffffffffffffeab,
                                                              CONCAT12(in_stack_fffffffffffffeaa,
                                                                       in_stack_fffffffffffffea8))))
                                  )));
      ShortDnaSequence::operator[]
                (in_stack_fffffffffffffeb0,
                 CONCAT17(in_stack_fffffffffffffeaf,
                          CONCAT16(in_stack_fffffffffffffeae,
                                   CONCAT15(in_stack_fffffffffffffead,
                                            CONCAT14(in_stack_fffffffffffffeac,
                                                     CONCAT13(in_stack_fffffffffffffeab,
                                                              CONCAT12(in_stack_fffffffffffffeaa,
                                                                       in_stack_fffffffffffffea8))))
                                  )));
      ShortDnaSequence::qualityChar
                (in_stack_fffffffffffffeb0,
                 CONCAT17(in_stack_fffffffffffffeaf,
                          CONCAT16(in_stack_fffffffffffffeae,
                                   CONCAT15(in_stack_fffffffffffffead,
                                            CONCAT14(in_stack_fffffffffffffeac,
                                                     CONCAT13(in_stack_fffffffffffffeab,
                                                              CONCAT12(in_stack_fffffffffffffeaa,
                                                                       in_stack_fffffffffffffea8))))
                                  )));
      pVar3 = computeEntry((char *)CONCAT17(in_stack_fffffffffffffecf,
                                            CONCAT16(in_stack_fffffffffffffece,
                                                     CONCAT15(in_stack_fffffffffffffecd,
                                                              in_stack_fffffffffffffec8))),
                           in_stack_fffffffffffffec0,
                           (char *)CONCAT17(in_stack_fffffffffffffebf,
                                            CONCAT16(in_stack_fffffffffffffebe,
                                                     CONCAT15(in_stack_fffffffffffffebd,
                                                              in_stack_fffffffffffffeb8))),
                           (char *)in_stack_fffffffffffffeb0);
      local_c2 = pVar3.first;
      std::__cxx11::string::operator+=(local_28,local_c2);
      std::__cxx11::string::operator+=(local_10,local_c2);
      cStack_c1 = pVar3.second;
      std::__cxx11::string::operator+=(local_30,cStack_c1);
      std::__cxx11::string::operator+=(in_stack_00000008,local_31);
      if (local_31 == 'I') {
        std::__cxx11::string::operator+=(local_18,'I');
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::at((ulong)local_68);
        std::__cxx11::string::operator+=(local_18,*pcVar6);
      }
    }
    if (local_31 != 'I') {
      *in_stack_00000038 = *in_stack_00000038 + 1;
      *in_stack_00000030 = *in_stack_00000030 + 1;
    }
    *in_stack_00000020 = *in_stack_00000020 + 1;
    *in_stack_00000028 = *in_stack_00000028 + 1;
    *in_stack_00000010 = *in_stack_00000010 + 1;
    *in_stack_00000018 = *in_stack_00000018 + 1;
  }
  else if ((((local_31 == 'D') && (local_32 == 'D')) || ((local_31 == 'H' && (local_32 == 'H')))) ||
          ((((local_31 == 'D' && (local_32 == 'H')) || ((local_31 == 'H' && (local_32 == 'D')))) ||
           (((local_31 == 'D' && (local_32 == 'S')) || ((local_31 == 'S' && (local_32 == 'D'))))))))
  {
    *in_stack_00000010 = *in_stack_00000010 + 1;
    *in_stack_00000018 = *in_stack_00000018 + 1;
    pcVar6 = (char *)std::__cxx11::string::at((ulong)local_68);
    std::__cxx11::string::operator+=(local_18,*pcVar6);
    *in_stack_00000038 = *in_stack_00000038 + 1;
    *in_stack_00000030 = *in_stack_00000030 + 1;
    if ((local_31 == 'D') || (local_32 == 'D')) {
      std::__cxx11::string::operator+=(in_stack_00000008,'D');
      std::__cxx11::string::operator+=(local_10,'D');
    }
    if (local_31 == 'S') {
      *in_stack_00000020 = *in_stack_00000020 + 1;
    }
    else if (local_32 == 'S') {
      *in_stack_00000028 = *in_stack_00000028 + 1;
    }
  }
  else if ((((local_31 == 'M') && (((local_32 == 'D' || (local_32 == 'H')) || (local_32 == 'S'))))
           || ((((local_31 == 'D' || (local_31 == 'H')) || (local_31 == 'S')) && (local_32 == 'M')))
           ) || (((local_31 == 'S' && (local_32 == 'H')) || ((local_31 == 'H' && (local_32 == 'S')))
                 ))) {
    if (local_31 == 'M') {
      std::__cxx11::string::operator+=(in_stack_00000008,'M');
      cVar1 = ShortDnaSequence::operator[]
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(in_stack_fffffffffffffeac,
                                                             CONCAT13(in_stack_fffffffffffffeab,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_28,cVar1);
      cVar1 = ShortDnaSequence::operator[]
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(in_stack_fffffffffffffeac,
                                                             CONCAT13(in_stack_fffffffffffffeab,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_10,cVar1);
      cVar1 = ShortDnaSequence::qualityChar
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(in_stack_fffffffffffffeac,
                                                             CONCAT13(in_stack_fffffffffffffeab,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_30,cVar1);
      pcVar6 = (char *)std::__cxx11::string::at((ulong)local_68);
      std::__cxx11::string::operator+=(local_18,*pcVar6);
      *in_stack_00000038 = *in_stack_00000038 + 1;
      *in_stack_00000030 = *in_stack_00000030 + 1;
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *in_stack_00000018 = *in_stack_00000018 + 1;
      *in_stack_00000020 = *in_stack_00000020 + 1;
      if (local_32 == 'S') {
        *in_stack_00000028 = *in_stack_00000028 + 1;
      }
    }
    else if (local_32 == 'M') {
      std::__cxx11::string::operator+=(in_stack_00000008,'M');
      cVar1 = ShortDnaSequence::operator[]
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(in_stack_fffffffffffffeac,
                                                             CONCAT13(in_stack_fffffffffffffeab,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_28,cVar1);
      cVar1 = ShortDnaSequence::operator[]
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(in_stack_fffffffffffffeac,
                                                             CONCAT13(in_stack_fffffffffffffeab,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_10,cVar1);
      cVar1 = ShortDnaSequence::qualityChar
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(in_stack_fffffffffffffeac,
                                                             CONCAT13(in_stack_fffffffffffffeab,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_30,cVar1);
      pcVar6 = (char *)std::__cxx11::string::at((ulong)local_68);
      std::__cxx11::string::operator+=(local_18,*pcVar6);
      *in_stack_00000038 = *in_stack_00000038 + 1;
      *in_stack_00000030 = *in_stack_00000030 + 1;
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *in_stack_00000018 = *in_stack_00000018 + 1;
      *in_stack_00000028 = *in_stack_00000028 + 1;
      if (local_31 == 'S') {
        *in_stack_00000020 = *in_stack_00000020 + 1;
      }
    }
    else if (local_31 == 'S') {
      *in_stack_00000038 = *in_stack_00000038 + 1;
      *in_stack_00000030 = *in_stack_00000030 + 1;
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *in_stack_00000018 = *in_stack_00000018 + 1;
      *in_stack_00000020 = *in_stack_00000020 + 1;
    }
    else {
      *in_stack_00000038 = *in_stack_00000038 + 1;
      *in_stack_00000030 = *in_stack_00000030 + 1;
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *in_stack_00000018 = *in_stack_00000018 + 1;
      *in_stack_00000028 = *in_stack_00000028 + 1;
    }
  }
  else if ((local_31 == 'I') || (local_32 == 'I')) {
    if (local_31 == 'I') {
      std::__cxx11::string::operator+=(in_stack_00000008,'I');
      cVar1 = ShortDnaSequence::operator[]
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(in_stack_fffffffffffffeac,
                                                             CONCAT13(in_stack_fffffffffffffeab,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_28,cVar1);
      cVar2 = ShortDnaSequence::operator[]
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(cVar1,CONCAT16(in_stack_fffffffffffffeae,
                                                 CONCAT15(in_stack_fffffffffffffead,
                                                          CONCAT14(in_stack_fffffffffffffeac,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffeab,
                                                  CONCAT12(in_stack_fffffffffffffeaa,
                                                           in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_10,cVar2);
      cVar1 = ShortDnaSequence::qualityChar
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(cVar1,CONCAT16(cVar2,CONCAT15(in_stack_fffffffffffffead,
                                                                CONCAT14(in_stack_fffffffffffffeac,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffeab,
                                                  CONCAT12(in_stack_fffffffffffffeaa,
                                                           in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_30,cVar1);
      std::__cxx11::string::operator+=(local_18,'I');
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *in_stack_00000020 = *in_stack_00000020 + 1;
    }
    else {
      std::__cxx11::string::operator+=(in_stack_00000008,'I');
      cVar1 = ShortDnaSequence::operator[]
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(in_stack_fffffffffffffeac,
                                                             CONCAT13(in_stack_fffffffffffffeab,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_28,cVar1);
      cVar2 = ShortDnaSequence::operator[]
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(cVar1,CONCAT13(
                                                  in_stack_fffffffffffffeab,
                                                  CONCAT12(in_stack_fffffffffffffeaa,
                                                           in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_10,cVar2);
      cVar1 = ShortDnaSequence::qualityChar
                        (in_stack_fffffffffffffeb0,
                         CONCAT17(in_stack_fffffffffffffeaf,
                                  CONCAT16(in_stack_fffffffffffffeae,
                                           CONCAT15(in_stack_fffffffffffffead,
                                                    CONCAT14(cVar1,CONCAT13(cVar2,CONCAT12(
                                                  in_stack_fffffffffffffeaa,
                                                  in_stack_fffffffffffffea8)))))));
      std::__cxx11::string::operator+=(local_30,cVar1);
      std::__cxx11::string::operator+=(local_18,'I');
      *in_stack_00000018 = *in_stack_00000018 + 1;
      *in_stack_00000028 = *in_stack_00000028 + 1;
    }
  }
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void AlignmentRecord::overlapMerge(std::string& algn,std::string& ref,const AlignmentRecord& ar, std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos1, int& c_pos2, int& q_pos1, int& q_pos2, int& ref_pos, int& ref_rel_pos, int i, int j) const{
    char c1, c2;
    const ShortDnaSequence* s1,* s2 = 0;
    std::string r = "";
    if (i == 1){
        c1 = this->cigar1_unrolled[c_pos1];
        s1 = &this->sequence1;
        r = this->getReferenceSeq1();
        if(j == 1){
            c2 = ar.getCigar1Unrolled()[c_pos2];
            s2 = &ar.getSequence1();
        } else {
            c2 = ar.getCigar2Unrolled()[c_pos2];
            s2 = &ar.getSequence2();
        }
    } else {
        c1 = this->cigar2_unrolled[c_pos1];

        s1 = &this->sequence2;
        r = this->getReferenceSeq2();
        if(j == 1){
            c2 = ar.getCigar1Unrolled()[c_pos2];
            s2 = &ar.getSequence1();
        } else {
            c2 = ar.getCigar2Unrolled()[c_pos2];
            s2 = &ar.getSequence2();
        }
    }
    if((c1 == 'M' && c2 == 'M') || (c1 == 'S' && c2 == 'S') || (c1 == 'I' && c2 == 'I')){

        if (c1 != 'S'){
            std::pair<char,char> resPair = computeEntry((*s1)[q_pos1],s1->qualityChar(q_pos1),(*s2)[q_pos2],s2->qualityChar(q_pos2));
            dna += resPair.first;
            algn += resPair.first;
            qualities += resPair.second;
            nucigar += c1;
            if(c1=='I'){
                ref+= 'I';
            }else{
                ref+= r.at(ref_rel_pos);
            }
        }
        if (c1 != 'I'){
            ref_rel_pos++;
            ref_pos++;
        }
        q_pos1++;
        q_pos2++;
        c_pos1++;
        c_pos2++;
    } else if ((c1 == 'D' && c2 == 'D') || (c1 == 'H' && c2 == 'H') || (c1 == 'D' && c2 == 'H') || (c1 == 'H' && c2 == 'D') || (c1 == 'D' && c2 == 'S') || (c1 == 'S' && c2 == 'D')){

        c_pos1++;
        c_pos2++;
        ref+= r.at(ref_rel_pos);
        ref_rel_pos++;
        ref_pos++;
        if (c1 == 'D' || c2 == 'D'){
            nucigar += 'D';
            algn +='D';
        }
        if (c1 == 'S'){
            q_pos1++;
        } else if(c2 == 'S'){
            q_pos2++;
        }
    } else if ((c1 == 'M' && (c2 == 'D' || c2 == 'H' || c2 == 'S')) || ((c1 == 'D' || c1 == 'H' || c1 == 'S') && c2 == 'M') || (c1 == 'S' && c2 == 'H') || (c1 == 'H' && c2 == 'S')) {

        if (c1 == 'M'){
            nucigar += 'M';
            dna += (*s1)[q_pos1];
            algn+=(*s1)[q_pos1];
            qualities += s1->qualityChar(q_pos1);
            ref+= r.at(ref_rel_pos);
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
            if (c2 == 'S') q_pos2++;
        } else if (c2 == 'M'){
            nucigar += 'M';
            dna +=  (*s2)[q_pos2];
            algn+= (*s2)[q_pos2];
            qualities += s2->qualityChar(q_pos2);
            ref+= r.at(ref_rel_pos);
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
            if (c1 == 'S') q_pos1++;
        } else if (c1 == 'S'){
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
        } else {
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
        }
    } else if (c1 == 'I' || c2 == 'I'){

        if(c1 == 'I'){
            nucigar += 'I';
            dna += (*s1)[q_pos1];
            algn+=(*s1)[q_pos1];
            qualities += s1->qualityChar(q_pos1);
            ref+= 'I';
            c_pos1++;
            q_pos1++;
        } else {
            nucigar += 'I';
            dna +=  (*s2)[q_pos2];
            algn+=(*s2)[q_pos2];
            qualities += s2->qualityChar(q_pos2);
            ref+= 'I';
            c_pos2++;
            q_pos2++;
        }
    } else{
        assert(false);
    }
}